

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  cmExternalMakefileProjectGenerator *this_00;
  undefined4 extraout_var;
  pointer ppcVar4;
  cmGlobalGenerator *this_01;
  string name;
  key_type local_70;
  string local_50;
  
  pcVar1 = (gname->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + gname->_M_string_length);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
          ::find(&(this->ExtraGenerators)._M_t,&local_70);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (cmExternalMakefileProjectGenerator *)0x0;
  }
  else {
    this_00 = (cmExternalMakefileProjectGenerator *)(**(code **)(iVar3._M_node + 2))();
    cmExternalMakefileProjectGenerator::GetGlobalGeneratorName(&local_50,this_00,&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  ppcVar4 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar4 ==
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_01 = (cmGlobalGenerator *)0x0;
  }
  else {
    do {
      iVar2 = (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar4,&local_70,this);
      this_01 = (cmGlobalGenerator *)CONCAT44(extraout_var,iVar2);
      if ((cmGlobalGenerator *)CONCAT44(extraout_var,iVar2) != (cmGlobalGenerator *)0x0) break;
      ppcVar4 = ppcVar4 + 1;
      this_01 = (cmGlobalGenerator *)0x0;
    } while (ppcVar4 !=
             (this->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (this_01 == (cmGlobalGenerator *)0x0) {
    if (this_00 != (cmExternalMakefileProjectGenerator *)0x0) {
      (*this_00->_vptr_cmExternalMakefileProjectGenerator[1])(this_00);
    }
  }
  else {
    cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_01,this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return this_01;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  cmExternalMakefileProjectGenerator* extraGenerator = 0;
  std::string name = gname;
  RegisteredExtraGeneratorsMap::const_iterator extraGenIt =
                                            this->ExtraGenerators.find(name);
  if (extraGenIt != this->ExtraGenerators.end())
    {
    extraGenerator = (extraGenIt->second)();
    name = extraGenerator->GetGlobalGeneratorName(name);
    }

  cmGlobalGenerator* generator = 0;
  for (RegisteredGeneratorsVector::const_iterator i =
    this->Generators.begin(); i != this->Generators.end(); ++i)
    {
    generator = (*i)->CreateGlobalGenerator(name, this);
    if (generator)
      {
      break;
      }
    }

  if (generator)
    {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
    }
  else
    {
    delete extraGenerator;
    }

  return generator;
}